

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void cftfsub(size_t n,float *a,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  size_t l;
  size_t j3;
  size_t j2;
  size_t j1;
  size_t j;
  float *w_local;
  float *a_local;
  size_t n_local;
  
  _x0i = 2;
  if (8 < n) {
    cft1st(n,a,w);
    for (_x0i = 8; _x0i << 2 < n; _x0i = _x0i << 2) {
      cftmdl(n,_x0i,a,w);
    }
  }
  if (_x0i << 2 == n) {
    for (j1 = 0; j1 < _x0i; j1 = j1 + 2) {
      lVar17 = j1 + _x0i;
      lVar18 = lVar17 + _x0i;
      lVar19 = lVar18 + _x0i;
      fVar1 = a[j1];
      fVar2 = a[lVar17];
      fVar3 = a[j1 + 1];
      fVar4 = a[lVar17 + 1];
      fVar5 = a[j1];
      fVar6 = a[lVar17];
      fVar7 = a[j1 + 1];
      fVar8 = a[lVar17 + 1];
      fVar9 = a[lVar18];
      fVar10 = a[lVar19];
      fVar11 = a[lVar18 + 1];
      fVar12 = a[lVar19 + 1];
      fVar13 = a[lVar18];
      fVar14 = a[lVar19];
      fVar15 = a[lVar18 + 1];
      fVar16 = a[lVar19 + 1];
      a[j1] = fVar1 + fVar2 + fVar9 + fVar10;
      a[j1 + 1] = fVar3 + fVar4 + fVar11 + fVar12;
      a[lVar18] = (fVar1 + fVar2) - (fVar9 + fVar10);
      a[lVar18 + 1] = (fVar3 + fVar4) - (fVar11 + fVar12);
      a[lVar17] = (fVar5 - fVar6) - (fVar15 - fVar16);
      a[lVar17 + 1] = (fVar7 - fVar8) + (fVar13 - fVar14);
      a[lVar19] = (fVar5 - fVar6) + (fVar15 - fVar16);
      a[lVar19 + 1] = (fVar7 - fVar8) - (fVar13 - fVar14);
    }
  }
  else {
    for (j1 = 0; j1 < _x0i; j1 = j1 + 2) {
      lVar17 = j1 + _x0i;
      fVar1 = a[j1];
      fVar2 = a[lVar17];
      fVar3 = a[j1 + 1];
      fVar4 = a[lVar17 + 1];
      a[j1] = a[lVar17] + a[j1];
      a[j1 + 1] = a[lVar17 + 1] + a[j1 + 1];
      a[lVar17] = fVar1 - fVar2;
      a[lVar17 + 1] = fVar3 - fVar4;
    }
  }
  return;
}

Assistant:

static void cftfsub(size_t n, float *a, float *w)
{
    size_t j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}